

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomReporter.cpp
# Opt level: O2

shared_ptr<ApprovalTests::GenericDiffReporter> __thiscall
ApprovalTests::CustomReporter::create(CustomReporter *this,string *path,string *arguments,Type type)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<ApprovalTests::GenericDiffReporter> sVar1;
  DiffInfo info;
  string local_b0;
  string local_90;
  DiffInfo local_70;
  
  ::std::__cxx11::string::string((string *)&local_90,(string *)path);
  ::std::__cxx11::string::string((string *)&local_b0,(string *)arguments);
  DiffInfo::DiffInfo(&local_70,&local_90,&local_b0,type);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::make_shared<ApprovalTests::GenericDiffReporter,ApprovalTests::DiffInfo&>((DiffInfo *)this);
  DiffInfo::~DiffInfo(&local_70);
  sVar1.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<ApprovalTests::GenericDiffReporter>)
         sVar1.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<GenericDiffReporter>
    CustomReporter::create(std::string path, std::string arguments, Type type)
    {
        DiffInfo info(std::move(path), std::move(arguments), type);
        return std::make_shared<GenericDiffReporter>(info);
    }